

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::ImageSamplingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,ImageSamplingInstance *this)

{
  VkComponentMapping *swz;
  RasterizationState *this_00;
  float fVar1;
  TestTexture *pTVar2;
  TestLog *pTVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 queueFamilyIndex;
  VkPhysicalDeviceProperties *pVVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  bool bVar8;
  ConstPixelBufferAccess *pCVar9;
  long lVar10;
  void *__buf;
  void *__buf_00;
  bool bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  allocator<char> local_5b4;
  allocator<char> local_5b3;
  allocator<char> local_5b2;
  allocator<char> local_5b1;
  Vec2 lodBounds;
  long local_590;
  VkImageSubresourceRange subresource;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  Vec4 lookupScale;
  Vec4 lookupBias;
  undefined1 local_528 [32];
  RasterizationState RStack_508;
  string local_4f0;
  string local_4d0;
  TextureFormat depthStencilFormat;
  TextureFormat colorFormat;
  PixelBufferAccess errorAccess;
  TextureLevel errorMask;
  string local_450;
  string local_430;
  ConstPixelBufferAccess coordAccess;
  RenderState renderState;
  LookupPrecision relaxedPrecision;
  Sampler sampler;
  Program rrProgram;
  CoordinateCaptureProgram coordCaptureProgram;
  ReferenceRenderer refRenderer;
  ConstPixelBufferAccess resultAccess;
  
  pVVar7 = Context::getDeviceProperties((this->super_TestInstance).m_context);
  colorFormat.order = RGBA;
  colorFormat.type = FLOAT;
  depthStencilFormat.order = CHANNELORDER_LAST;
  depthStencilFormat.type = CHANNELTYPE_LAST;
  CoordinateCaptureProgram::CoordinateCaptureProgram(&coordCaptureProgram);
  rrProgram.vertexShader = &coordCaptureProgram.m_vertexShader.super_VertexShader;
  rrProgram.fragmentShader = &coordCaptureProgram.m_fragmentShader.super_FragmentShader;
  rrProgram.geometryShader = (GeometryShader *)0x0;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &colorFormat,&depthStencilFormat,&rrProgram);
  tcu::Vector<float,_4>::Vector(&lookupScale,1.0);
  tcu::Vector<float,_4>::Vector(&lookupBias,0.0);
  getLookupScaleBias(this->m_imageFormat,&lookupScale,&lookupBias);
  ReferenceRenderer::getViewportState(&refRenderer);
  rr::RenderState::RenderState
            (&renderState,(ViewportState *)&relaxedPrecision,VIEWPORTORIENTATION_LOWER_LEFT);
  ReferenceRenderer::draw(&refRenderer,&renderState,PRIMITIVETYPE_TRIANGLES,&this->m_vertices);
  ::vk::mapVkSampler(&sampler,&this->m_samplerParams);
  fVar1 = (this->m_samplerParams).minLod;
  fVar13 = (this->m_samplerParams).mipLodBias + this->m_samplerLod;
  fVar14 = (this->m_samplerParams).maxLod;
  if (fVar13 <= fVar14) {
    fVar14 = fVar13;
  }
  uVar12 = -(uint)(fVar13 < fVar1);
  fVar1 = (float)(uVar12 & (uint)fVar1 | ~uVar12 & (uint)fVar14);
  fVar14 = 1.0 / (float)~(-1 << ((byte)(pVVar7->limits).mipmapPrecisionBits & 0x1f));
  lodBounds.m_data[0] = fVar1 - fVar14;
  lodBounds.m_data[1] = fVar14 + fVar1;
  pTVar2 = (this->m_texture).
           super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
           .m_data.ptr;
  subresource.layerCount = (this->m_subresourceRange).layerCount;
  subresource.aspectMask = (this->m_subresourceRange).aspectMask;
  subresource.baseMipLevel = (this->m_subresourceRange).baseMipLevel;
  subresource.levelCount = (this->m_subresourceRange).levelCount;
  subresource.baseArrayLayer = (this->m_subresourceRange).baseArrayLayer;
  if ((this->m_subresourceRange).levelCount == 0xffffffff) {
    iVar6 = (*pTVar2->_vptr_TestTexture[2])(pTVar2);
    subresource.levelCount = iVar6 - (this->m_subresourceRange).baseMipLevel;
  }
  if ((this->m_subresourceRange).layerCount == 0xffffffff) {
    iVar6 = (*pTVar2->_vptr_TestTexture[4])(pTVar2);
    subresource.layerCount = iVar6 - (this->m_subresourceRange).baseArrayLayer;
  }
  ReferenceRenderer::getAccess((PixelBufferAccess *)&renderState,&refRenderer);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&coordAccess,(ConstPixelBufferAccess *)&renderState);
  renderState.cullMode = 8;
  renderState.provokingVertexConvention = 3;
  tcu::TextureLevel::TextureLevel
            (&errorMask,(TextureFormat *)&renderState,(this->m_renderSize).m_data[0],
             (this->m_renderSize).m_data[1],1);
  tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
  iVar6 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar11 = true;
  if (*(int *)(CONCAT44(extraout_var,iVar6) + 4) == 0) {
    if ((this->m_samplerParams).minFilter == VK_FILTER_LINEAR) {
      bVar11 = false;
    }
    else {
      bVar11 = (this->m_samplerParams).magFilter != VK_FILTER_LINEAR;
    }
  }
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_528);
  local_528._0_4_ = 0x11;
  local_528._4_4_ = 0x11;
  local_528._8_4_ = 0x11;
  local_528._12_4_ = 5;
  local_528._16_4_ = 5;
  local_528._20_4_ = 5;
  tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&renderState,true);
  RStack_508.verticalFill = renderState.cullMode;
  resultAccess.m_format.order = RGBA;
  resultAccess.m_format.type = UNORM_SHORT_565;
  resultAccess.m_size.m_data[0] = 8;
  resultAccess.m_size.m_data[1] = 8;
  tcu::computeFixedPointThreshold((tcu *)&relaxedPrecision,(IVec4 *)&resultAccess);
  swz = &this->m_componentMapping;
  pipeline::anon_unknown_0::swizzleScaleBias((anon_unknown_0 *)&local_4f0,&lookupScale,swz);
  tcu::operator/((tcu *)&renderState,(Vector<float,_4> *)&relaxedPrecision,
                 (Vector<float,_4> *)&local_4f0);
  local_528._24_4_ = renderState.cullMode;
  local_528._28_4_ = renderState.provokingVertexConvention;
  RStack_508.winding = renderState.rasterization.winding;
  RStack_508.horizontalFill = renderState.rasterization.horizontalFill;
  iVar6 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar4 = tcu::isSRGB(*(TextureFormat *)CONCAT44(extraout_var_00,iVar6));
  if (bVar4) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderState,0.015686275);
    tcu::Vector<float,_4>::operator+=
              ((Vector<float,_4> *)(local_528 + 0x18),(Vector<float,_4> *)&renderState);
  }
  bVar4 = true;
  local_590 = 0;
  bVar8 = false;
  for (lVar10 = 0; lVar10 < this->m_imageCount; lVar10 = lVar10 + 1) {
    vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
    device = Context::getDevice((this->super_TestInstance).m_context);
    queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
    queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
    allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
    readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                        &renderState,vk,device,queue,queueFamilyIndex,allocator,
                        (VkImage)**(deUint64 **)
                                   ((long)&((this->m_colorImages).
                                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                   local_590),this->m_colorFormat,&this->m_renderSize);
    result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
         (TextureLevel *)renderState._0_8_;
    renderState.cullMode = CULLMODE_NONE;
    renderState.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
              ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&renderState
              );
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&renderState,
               result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
               m_data.ptr);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&resultAccess,(ConstPixelBufferAccess *)&renderState);
    bVar5 = pipeline::anon_unknown_0::validateResultImage
                      ((this->m_texture).
                       super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                       .m_data.ptr,this->m_imageViewType,&subresource,&sampler,swz,&coordAccess,
                       &lodBounds,(LookupPrecision *)local_528,&lookupScale,&lookupBias,
                       &resultAccess,&errorAccess);
    this_00 = &renderState.rasterization;
    if (!bVar5 && !bVar11) {
      tcu::LookupPrecision::LookupPrecision(&relaxedPrecision);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderState,0.015686275);
      tcu::Vector<float,_4>::operator+=
                (&relaxedPrecision.colorThreshold,(Vector<float,_4> *)&renderState);
      renderState._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<((ostream *)this_00,
                      "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&renderState,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      bVar5 = pipeline::anon_unknown_0::validateResultImage
                        ((this->m_texture).
                         super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                         .m_data.ptr,this->m_imageViewType,&subresource,&sampler,swz,&coordAccess,
                         &lodBounds,&relaxedPrecision,&lookupScale,&lookupBias,&resultAccess,
                         &errorAccess);
      bVar8 = true;
    }
    if (bVar5 == false) {
      pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"Result",&local_5b1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"Result Image",&local_5b2);
      pCVar9 = &resultAccess;
      tcu::LogImage::LogImage
                ((LogImage *)&renderState,&local_4f0,&local_430,&resultAccess,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      iVar6 = (int)pTVar3;
      tcu::LogImage::write((LogImage *)&renderState,iVar6,__buf,(size_t)pCVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4d0,"ErrorMask",&local_5b3);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"Error Mask",&local_5b4);
      pCVar9 = &errorAccess.super_ConstPixelBufferAccess;
      tcu::LogImage::LogImage
                ((LogImage *)&relaxedPrecision,&local_4d0,&local_450,pCVar9,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&relaxedPrecision,iVar6,__buf_00,(size_t)pCVar9);
      tcu::LogImage::~LogImage((LogImage *)&relaxedPrecision);
      std::__cxx11::string::~string((string *)&local_450);
      std::__cxx11::string::~string((string *)&local_4d0);
      tcu::LogImage::~LogImage((LogImage *)&renderState);
      std::__cxx11::string::~string((string *)&local_430);
      std::__cxx11::string::~string((string *)&local_4f0);
    }
    bVar4 = (bool)(bVar4 & bVar5 != false);
    de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::~UniqueBase
              (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
    local_590 = local_590 + 0x10;
  }
  tcu::TextureLevel::~TextureLevel(&errorMask);
  if (bVar4) {
    if (bVar8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&renderState,"Inaccurate filtering results",
                 (allocator<char> *)&relaxedPrecision);
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->m_description,(string *)&renderState);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&renderState,"Result image matches reference",
                 (allocator<char> *)&relaxedPrecision);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&renderState);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&renderState,"Image mismatch",(allocator<char> *)&relaxedPrecision);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&renderState);
  }
  std::__cxx11::string::~string((string *)&renderState);
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  CoordinateCaptureProgram::~CoordinateCaptureProgram(&coordCaptureProgram);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ImageSamplingInstance::verifyImage (void)
{
	const VkPhysicalDeviceLimits&		limits					= m_context.getDeviceProperties().limits;
	// \note Color buffer is used to capture coordinates - not sampled texture values
	const tcu::TextureFormat			colorFormat				(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
	const tcu::TextureFormat			depthStencilFormat;		// Undefined depth/stencil format.
	const CoordinateCaptureProgram		coordCaptureProgram;
	const rr::Program					rrProgram				= coordCaptureProgram.getReferenceProgram();
	ReferenceRenderer					refRenderer				(m_renderSize.x(), m_renderSize.y(), 1, colorFormat, depthStencilFormat, &rrProgram);

	bool								compareOkAll			= true;
	bool								anyWarnings				= false;

	tcu::Vec4							lookupScale				(1.0f);
	tcu::Vec4							lookupBias				(0.0f);

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	// Render out coordinates
	{
		const rr::RenderState renderState(refRenderer.getViewportState());
		refRenderer.draw(renderState, rr::PRIMITIVETYPE_TRIANGLES, m_vertices);
	}

	// Verify results
	{
		const tcu::Sampler					sampler			= mapVkSampler(m_samplerParams);
		const float							referenceLod	= de::clamp(m_samplerParams.mipLodBias + m_samplerLod, m_samplerParams.minLod, m_samplerParams.maxLod);
		const float							lodError		= 1.0f / static_cast<float>((1u << limits.mipmapPrecisionBits) - 1u);
		const tcu::Vec2						lodBounds		(referenceLod - lodError, referenceLod + lodError);
		const vk::VkImageSubresourceRange	subresource		= resolveSubresourceRange(*m_texture, m_subresourceRange);

		const tcu::ConstPixelBufferAccess	coordAccess		= refRenderer.getAccess();
		tcu::TextureLevel					errorMask		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), (int)m_renderSize.x(), (int)m_renderSize.y());
		const tcu::PixelBufferAccess		errorAccess		= errorMask.getAccess();

		const bool							allowSnorm8Bug	= m_texture->getTextureFormat().type == tcu::TextureFormat::SNORM_INT8 &&
															  (m_samplerParams.minFilter == VK_FILTER_LINEAR || m_samplerParams.magFilter == VK_FILTER_LINEAR);

		tcu::LookupPrecision				lookupPrecision;

		// Set precision requirements - very low for these tests as
		// the point of the test is not to validate accuracy.
		lookupPrecision.coordBits		= tcu::IVec3(17, 17, 17);
		lookupPrecision.uvwBits			= tcu::IVec3(5, 5, 5);
		lookupPrecision.colorMask		= tcu::BVec4(true);
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(tcu::IVec4(8, 8, 8, 8)) / swizzleScaleBias(lookupScale, m_componentMapping);

		if (tcu::isSRGB(m_texture->getTextureFormat()))
			lookupPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

		for (int imgNdx = 0; imgNdx < m_imageCount; ++imgNdx)
		{
			// Read back result image
			UniquePtr<tcu::TextureLevel>		result			(readColorAttachment(m_context.getDeviceInterface(),
																					 m_context.getDevice(),
																					 m_context.getUniversalQueue(),
																					 m_context.getUniversalQueueFamilyIndex(),
																					 m_context.getDefaultAllocator(),
																					 **m_colorImages[imgNdx],
																					 m_colorFormat,
																					 m_renderSize));
			const tcu::ConstPixelBufferAccess	resultAccess	= result->getAccess();
			bool								compareOk		= validateResultImage(*m_texture,
																					  m_imageViewType,
																					  subresource,
																					  sampler,
																					  m_componentMapping,
																					  coordAccess,
																					  lodBounds,
																					  lookupPrecision,
																					  lookupScale,
																					  lookupBias,
																					  resultAccess,
																					  errorAccess);

			if (!compareOk && allowSnorm8Bug)
			{
				// HW waiver (VK-GL-CTS issue: 229)
				//
				// Due to an error in bit replication of the fixed point SNORM values, linear filtered
				// negative SNORM values will differ slightly from ideal precision in the last bit, moving
				// the values towards 0.
				//
				// This occurs on all members of the PowerVR Rogue family of GPUs
				tcu::LookupPrecision	relaxedPrecision;

				relaxedPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
					<< tcu::TestLog::EndMessage;
				anyWarnings = true;

				compareOk = validateResultImage(*m_texture,
												m_imageViewType,
												subresource,
												sampler,
												m_componentMapping,
												coordAccess,
												lodBounds,
												relaxedPrecision,
												lookupScale,
												lookupBias,
												resultAccess,
												errorAccess);
			}

			if (!compareOk)
				m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Result", "Result Image", resultAccess)
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorAccess);

			compareOkAll = compareOkAll && compareOk;
		}
	}

	if (compareOkAll)
	{
		if (anyWarnings)
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Inaccurate filtering results");
		else
			return tcu::TestStatus::pass("Result image matches reference");
	}
	else
		return tcu::TestStatus::fail("Image mismatch");
}